

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O0

bool __thiscall Nova::Parse_Args::Is_Value_Set(Parse_Args *this,string *arg_str)

{
  int iVar1;
  ostream *poVar2;
  const_reference pvVar3;
  int match;
  string *arg_str_local;
  Parse_Args *this_local;
  
  iVar1 = Find_Match(this,arg_str);
  if (iVar1 < 0) {
    poVar2 = std::operator<<(Log::(anonymous_namespace)::cerr,"Argument ");
    poVar2 = std::operator<<(poVar2,(string *)arg_str);
    poVar2 = std::operator<<(poVar2," undeclared");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  pvVar3 = std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::operator[]
                     (&this->arg_data_list,(long)iVar1);
  return (bool)(pvVar3->value_set & 1);
}

Assistant:

bool Parse_Args::
Is_Value_Set(const std::string& arg_str) const
{
    int match=Find_Match(arg_str);
    if(match<0)
    {
        Log::cerr<<"Argument "<<arg_str<<" undeclared"<<std::endl;
        exit(-1);
    }
    return arg_data_list[match].value_set;
}